

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrncatNew(xmlChar *str1,xmlChar *str2,int len)

{
  int len_00;
  xmlChar *ret;
  int size;
  int len_local;
  xmlChar *str2_local;
  xmlChar *str1_local;
  
  ret._4_4_ = len;
  if ((len < 0) && (ret._4_4_ = xmlStrlen(str2), ret._4_4_ < 0)) {
    str1_local = (xmlChar *)0x0;
  }
  else if ((str2 == (xmlChar *)0x0) || (ret._4_4_ == 0)) {
    str1_local = xmlStrdup(str1);
  }
  else if (str1 == (xmlChar *)0x0) {
    str1_local = xmlStrndup(str2,ret._4_4_);
  }
  else {
    len_00 = xmlStrlen(str1);
    if ((len_00 < 0) || (0x7fffffff - ret._4_4_ < len_00)) {
      str1_local = (xmlChar *)0x0;
    }
    else {
      str1_local = (xmlChar *)(*xmlMalloc)((long)len_00 + (long)ret._4_4_ + 1);
      if (str1_local == (xmlChar *)0x0) {
        xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
        str1_local = xmlStrndup(str1,len_00);
      }
      else {
        memcpy(str1_local,str1,(long)len_00);
        memcpy(str1_local + len_00,str2,(long)ret._4_4_);
        str1_local[len_00 + ret._4_4_] = '\0';
      }
    }
  }
  return str1_local;
}

Assistant:

xmlChar *
xmlStrncatNew(const xmlChar *str1, const xmlChar *str2, int len) {
    int size;
    xmlChar *ret;

    if (len < 0) {
        len = xmlStrlen(str2);
        if (len < 0)
            return(NULL);
    }
    if ((str2 == NULL) || (len == 0))
        return(xmlStrdup(str1));
    if (str1 == NULL)
        return(xmlStrndup(str2, len));

    size = xmlStrlen(str1);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlMalloc((size_t) size + len + 1);
    if (ret == NULL) {
        xmlErrMemory(NULL, NULL);
        return(xmlStrndup(str1, size));
    }
    memcpy(ret, str1, size);
    memcpy(&ret[size], str2, len);
    ret[size + len] = 0;
    return(ret);
}